

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O1

int colamd(int n_row,int n_col,int Alen,int *A,int *p,double *knobs,int *stats)

{
  double dVar1;
  int iVar2;
  Colamd_Col *Col;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int Alen_00;
  bool bVar12;
  int max_deg;
  int n_row2;
  int n_col2;
  Colamd_Row *local_e8;
  Colamd_Col *local_e0;
  double default_knobs [20];
  
  iVar3 = 0;
  iVar4 = 0;
  if (stats != (int *)0x0) {
    stats[0] = 0;
    stats[1] = 0;
    stats[2] = 0;
    stats[3] = 0;
    stats[4] = 0;
    stats[5] = 0;
    stats[6] = 0;
    stats[7] = 0;
    stats[0x10] = 0;
    stats[0x11] = 0;
    stats[0x12] = 0;
    stats[0x13] = 0;
    stats[0xc] = 0;
    stats[0xd] = 0;
    stats[0xe] = 0;
    stats[0xf] = 0;
    stats[8] = 0;
    stats[9] = 0;
    stats[10] = 0;
    stats[0xb] = 0;
    stats[3] = 0;
    stats[4] = -1;
    stats[5] = -1;
    if (A == (int *)0x0) {
      stats[3] = -1;
      iVar4 = iVar3;
    }
    else if (p == (int *)0x0) {
      stats[3] = -2;
      iVar4 = iVar3;
    }
    else if (n_row < 0) {
      stats[3] = -3;
      stats[4] = n_row;
      iVar4 = iVar3;
    }
    else if (n_col < 0) {
      stats[3] = -4;
      stats[4] = n_col;
      iVar4 = iVar3;
    }
    else {
      uVar9 = (ulong)(uint)n_col;
      iVar2 = p[uVar9];
      uVar10 = (ulong)iVar2;
      if ((long)uVar10 < 0) {
        stats[3] = -5;
        stats[4] = iVar2;
        iVar4 = iVar3;
      }
      else if (*p == 0) {
        if (knobs == (double *)0x0) {
          memset(default_knobs,0,0xa0);
          knobs = default_knobs;
          default_knobs[0] = 10.0;
          default_knobs[1] = 10.0;
          default_knobs[2] = 1.0;
        }
        dVar1 = knobs[2];
        uVar8 = uVar9 + 1;
        bVar12 = true;
        lVar7 = 0x18;
        uVar5 = 0;
        do {
          if (bVar12) {
            uVar6 = uVar8;
            if (uVar8 < uVar5) {
              uVar6 = uVar5;
            }
            bVar12 = uVar6 <= uVar5 + uVar8;
          }
          else {
            bVar12 = false;
          }
          if (bVar12) {
            uVar5 = uVar5 + uVar8;
          }
          else {
            uVar5 = 0;
          }
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        uVar6 = 0;
        uVar8 = (ulong)(n_row + 1);
        if (!bVar12) {
          uVar8 = uVar6;
        }
        lVar7 = 0x10;
        do {
          if (bVar12) {
            uVar11 = uVar8;
            if (uVar8 < uVar6) {
              uVar11 = uVar6;
            }
            bVar12 = uVar11 <= uVar6 + uVar8;
          }
          else {
            bVar12 = false;
          }
          if (bVar12) {
            uVar6 = uVar6 + uVar8;
          }
          else {
            uVar6 = 0;
          }
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        uVar5 = uVar5 >> 2;
        lVar7 = 2;
        uVar8 = 0;
        do {
          if (bVar12) {
            uVar11 = uVar10;
            if (uVar10 < uVar8) {
              uVar11 = uVar8;
            }
            bVar12 = uVar11 <= uVar8 + uVar10;
          }
          else {
            bVar12 = false;
          }
          if (bVar12) {
            uVar8 = uVar8 + uVar10;
          }
          else {
            uVar8 = 0;
          }
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        if (bVar12) {
          uVar10 = uVar9;
          if (uVar9 < uVar8) {
            uVar10 = uVar8;
          }
          bVar12 = uVar10 <= uVar8 + uVar9;
        }
        else {
          bVar12 = false;
        }
        uVar8 = uVar8 + uVar9;
        uVar10 = 0;
        uVar9 = uVar10;
        if (bVar12) {
          uVar9 = uVar5;
          if (uVar5 < uVar8) {
            uVar9 = uVar8;
          }
          uVar10 = (ulong)(uVar9 <= uVar8 + uVar5);
          uVar9 = uVar8;
        }
        uVar6 = uVar6 >> 2;
        uVar9 = uVar9 + uVar5;
        uVar11 = 0;
        uVar8 = uVar11;
        if ((char)uVar10 != '\0') {
          uVar10 = uVar6;
          if (uVar6 < uVar9) {
            uVar10 = uVar9;
          }
          uVar11 = (ulong)(uVar10 <= uVar9 + uVar6);
          uVar8 = uVar9;
        }
        uVar8 = uVar8 + uVar6;
        uVar9 = 0;
        if (((char)uVar11 == '\0') ||
           (uVar9 = uVar8, (ulong)(long)Alen < uVar8 || (uVar8 & 0xffffffff80000000) != 0)) {
          stats[3] = -7;
          stats[4] = (int)uVar9;
          stats[5] = Alen;
          iVar4 = 0;
        }
        else {
          Alen_00 = Alen - ((int)uVar6 + (int)uVar5);
          local_e0 = (Colamd_Col *)(A + Alen_00);
          local_e8 = (Colamd_Row *)(&local_e0->start + uVar5);
          iVar3 = init_rows_cols(n_row,n_col,local_e8,local_e0,A,p,stats);
          iVar4 = 0;
          if (iVar3 != 0) {
            init_scoring(n_row,n_col,local_e8,local_e0,A,p,knobs,&n_row2,&n_col2,&max_deg);
            Col = local_e0;
            iVar4 = find_ordering(n_row,n_col,Alen_00,local_e8,local_e0,A,p,n_col2,max_deg,iVar2 * 2
                                  ,-(uint)(dVar1 != 0.0) & 1);
            order_children(n_col,Col,p);
            *stats = n_row - n_row2;
            stats[1] = n_col - n_col2;
            stats[2] = iVar4;
            iVar4 = 1;
          }
        }
      }
      else {
        stats[3] = -6;
        stats[4] = *p;
      }
    }
  }
  return iVar4;
}

Assistant:

PUBLIC Int COLAMD_MAIN		/* returns TRUE if successful, FALSE otherwise*/
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows in A */
    Int n_col,			/* number of columns in A */
    Int Alen,			/* length of A */
    Int A [],			/* row indices of A */
    Int p [],			/* pointers to columns in A */
    double knobs [COLAMD_KNOBS],/* parameters (uses defaults if NULL) */
    Int stats [COLAMD_STATS]	/* output statistics and error codes */
)
{
    /* === Local variables ================================================== */

    Int i ;			/* loop index */
    Int nnz ;			/* nonzeros in A */
    size_t Row_size ;		/* size of Row [], in integers */
    size_t Col_size ;		/* size of Col [], in integers */
    size_t need ;		/* minimum required length of A */
    Colamd_Row *Row ;		/* pointer into A of Row [0..n_row] array */
    Colamd_Col *Col ;		/* pointer into A of Col [0..n_col] array */
    Int n_col2 ;		/* number of non-dense, non-empty columns */
    Int n_row2 ;		/* number of non-dense, non-empty rows */
    Int ngarbage ;		/* number of garbage collections performed */
    Int max_deg ;		/* maximum row degree */
    double default_knobs [COLAMD_KNOBS] ;	/* default knobs array */
    Int aggressive ;		/* do aggressive absorption */
    int ok ;

#ifndef NDEBUG
    colamd_get_debug ("colamd") ;
#endif /* NDEBUG */

    /* === Check the input arguments ======================================== */

    if (!stats)
    {
	DEBUG0 (("colamd: stats not present\n")) ;
	return (FALSE) ;
    }
    for (i = 0 ; i < COLAMD_STATS ; i++)
    {
	stats [i] = 0 ;
    }
    stats [COLAMD_STATUS] = COLAMD_OK ;
    stats [COLAMD_INFO1] = -1 ;
    stats [COLAMD_INFO2] = -1 ;

    if (!A)		/* A is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_A_not_present ;
	DEBUG0 (("colamd: A not present\n")) ;
	return (FALSE) ;
    }

    if (!p)		/* p is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p_not_present ;
	DEBUG0 (("colamd: p not present\n")) ;
    	return (FALSE) ;
    }

    if (n_row < 0)	/* n_row must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nrow_negative ;
	stats [COLAMD_INFO1] = n_row ;
	DEBUG0 (("colamd: nrow negative %d\n", n_row)) ;
    	return (FALSE) ;
    }

    if (n_col < 0)	/* n_col must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_ncol_negative ;
	stats [COLAMD_INFO1] = n_col ;
	DEBUG0 (("colamd: ncol negative %d\n", n_col)) ;
    	return (FALSE) ;
    }

    nnz = p [n_col] ;
    if (nnz < 0)	/* nnz must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nnz_negative ;
	stats [COLAMD_INFO1] = nnz ;
	DEBUG0 (("colamd: number of entries negative %d\n", nnz)) ;
	return (FALSE) ;
    }

    if (p [0] != 0)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p0_nonzero	;
	stats [COLAMD_INFO1] = p [0] ;
	DEBUG0 (("colamd: p[0] not zero %d\n", p [0])) ;
	return (FALSE) ;
    }

    /* === If no knobs, set default knobs =================================== */

    if (!knobs)
    {
	COLAMD_set_defaults (default_knobs) ;
	knobs = default_knobs ;
    }

    aggressive = (knobs [COLAMD_AGGRESSIVE] != FALSE) ;

    /* === Allocate the Row and Col arrays from array A ===================== */

    ok = TRUE ;
    Col_size = COLAMD_C (n_col, &ok) ;	    /* size of Col array of structs */
    Row_size = COLAMD_R (n_row, &ok) ;	    /* size of Row array of structs */

    /* need = 2*nnz + n_col + Col_size + Row_size ; */
    need = t_mult (nnz, 2, &ok) ;
    need = t_add (need, n_col, &ok) ;
    need = t_add (need, Col_size, &ok) ;
    need = t_add (need, Row_size, &ok) ;

    if (!ok || need > (size_t) Alen || need > Int_MAX)
    {
	/* not enough space in array A to perform the ordering */
	stats [COLAMD_STATUS] = COLAMD_ERROR_A_too_small ;
	stats [COLAMD_INFO1] = need ;
	stats [COLAMD_INFO2] = Alen ;
	DEBUG0 (("colamd: Need Alen >= %d, given only Alen = %d\n", need,Alen));
	return (FALSE) ;
    }

    Alen -= Col_size + Row_size ;
    Col = (Colamd_Col *) &A [Alen] ;
    Row = (Colamd_Row *) &A [Alen + Col_size] ;

    /* === Construct the row and column data structures ===================== */

    if (!init_rows_cols (n_row, n_col, Row, Col, A, p, stats))
    {
	/* input matrix is invalid */
	DEBUG0 (("colamd: Matrix invalid\n")) ;
	return (FALSE) ;
    }

    /* === Initialize scores, kill dense rows/columns ======================= */

    init_scoring (n_row, n_col, Row, Col, A, p, knobs,
	&n_row2, &n_col2, &max_deg) ;

    /* === Order the supercolumns =========================================== */

    ngarbage = find_ordering (n_row, n_col, Alen, Row, Col, A, p,
	n_col2, max_deg, 2*nnz, aggressive) ;

    /* === Order the non-principal columns ================================== */

    order_children (n_col, Col, p) ;

    /* === Return statistics in stats ======================================= */

    stats [COLAMD_DENSE_ROW] = n_row - n_row2 ;
    stats [COLAMD_DENSE_COL] = n_col - n_col2 ;
    stats [COLAMD_DEFRAG_COUNT] = ngarbage ;
    DEBUG0 (("colamd: done.\n")) ; 
    return (TRUE) ;
}